

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,NumericForStatement *num_for,void *data)

{
  bool bVar1;
  int iVar2;
  Instruction IVar3;
  int iVar4;
  Instruction IVar5;
  Instruction line_00;
  Instruction IVar6;
  Function *this_00;
  pointer pSVar7;
  size_t sVar8;
  long in_RSI;
  CodeGenerateVisitor *in_RDI;
  int index;
  int name_register;
  int index_1;
  Guard g_4;
  Guard l;
  Instruction instruction;
  Instruction instruction_1;
  ExpVarData_conflict step_exp_data;
  Guard g_3;
  int r_2;
  ExpVarData_conflict limit_exp_data;
  Guard g_2;
  int r_1;
  ExpVarData_conflict name_exp_data;
  Guard g_1;
  int r;
  int line;
  Function *function;
  int step_register;
  int limit_register;
  int var_register;
  Guard g;
  undefined8 in_stack_fffffffffffffbc8;
  OpType in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  function<void_()> *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  Guard *in_stack_fffffffffffffbf0;
  CodeGenerateVisitor *this_01;
  CodeGenerateVisitor *in_stack_fffffffffffffc00;
  CodeGenerateVisitor *this_02;
  int register_id;
  undefined4 in_stack_fffffffffffffc58;
  CodeGenerateVisitor local_310 [4];
  long local_2a0;
  CodeGenerateVisitor local_298 [2];
  uint local_254;
  uint local_250;
  undefined4 local_24c;
  uint local_248;
  uint local_244;
  ExpVarData local_240;
  int local_230;
  int local_1bc;
  ExpVarData local_1b8;
  int local_1a8;
  int local_134;
  ExpVarData local_130;
  int local_120;
  undefined1 local_118 [104];
  int local_b0;
  undefined4 local_ac;
  Function *local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  long local_10;
  
  local_10 = in_RSI;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::NumericForStatement*,void*)::__0,void>
            (in_stack_fffffffffffffbe0,
             (anon_class_8_1_8991fb9c *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::NumericForStatement*,void*)::__1,void>
            (in_stack_fffffffffffffbe0,
             (anon_class_8_1_8991fb9c *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  Guard::Guard(in_stack_fffffffffffffbf0,
               (function<void_()> *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
               in_stack_fffffffffffffbe0);
  std::function<void_()>::~function((function<void_()> *)0x20811d);
  std::function<void_()>::~function((function<void_()> *)0x20812a);
  local_98 = GenerateRegisterId(in_stack_fffffffffffffc00);
  local_9c = GenerateRegisterId(in_stack_fffffffffffffc00);
  local_a0 = GenerateRegisterId(in_stack_fffffffffffffc00);
  this_00 = GetCurrentFunction(in_RDI);
  local_ac = *(undefined4 *)(local_10 + 0x18);
  local_a8 = this_00;
  iVar2 = GetNextRegisterId(in_RDI);
  local_b0 = iVar2;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::NumericForStatement*,void*)::__2,void>
            (in_stack_fffffffffffffbe0,
             (anon_class_1_0_00000001 *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_120 = local_b0;
  register_id = (int)((ulong)local_118 >> 0x20);
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::NumericForStatement*,void*)::__3,void>
            (in_stack_fffffffffffffbe0,
             (anon_class_16_2_fd512ddf *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  Guard::Guard(in_stack_fffffffffffffbf0,
               (function<void_()> *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
               in_stack_fffffffffffffbe0);
  std::function<void_()>::~function((function<void_()> *)0x208277);
  std::function<void_()>::~function((function<void_()> *)0x208284);
  ExpVarData::ExpVarData(&local_130,local_98,local_98 + 1);
  pSVar7 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x2082af);
  (*pSVar7->_vptr_SyntaxTree[2])(pSVar7,in_RDI,&local_130);
  Guard::~Guard((Guard *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
  local_134 = GetNextRegisterId(in_RDI);
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::NumericForStatement*,void*)::__4,void>
            (in_stack_fffffffffffffbe0,
             (anon_class_1_0_00000001 *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_1a8 = local_134;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::NumericForStatement*,void*)::__5,void>
            (in_stack_fffffffffffffbe0,
             (anon_class_16_2_fd512ddf *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  Guard::Guard(in_stack_fffffffffffffbf0,
               (function<void_()> *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
               in_stack_fffffffffffffbe0);
  std::function<void_()>::~function((function<void_()> *)0x208370);
  std::function<void_()>::~function((function<void_()> *)0x20837d);
  ExpVarData::ExpVarData(&local_1b8,local_9c,local_9c + 1);
  pSVar7 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x2083a8);
  (*pSVar7->_vptr_SyntaxTree[2])(pSVar7,in_RDI,&local_1b8);
  Guard::~Guard((Guard *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
  local_1bc = GetNextRegisterId(in_RDI);
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::NumericForStatement*,void*)::__6,void>
            (in_stack_fffffffffffffbe0,
             (anon_class_1_0_00000001 *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_230 = local_1bc;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::NumericForStatement*,void*)::__7,void>
            (in_stack_fffffffffffffbe0,
             (anon_class_16_2_fd512ddf *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  Guard::Guard(in_stack_fffffffffffffbf0,
               (function<void_()> *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
               in_stack_fffffffffffffbe0);
  std::function<void_()>::~function((function<void_()> *)0x208469);
  std::function<void_()>::~function((function<void_()> *)0x208476);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x208487);
  if (bVar1) {
    ExpVarData::ExpVarData(&local_240,local_a0,local_a0 + 1);
    pSVar7 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x2084bb);
    (*pSVar7->_vptr_SyntaxTree[2])(pSVar7,in_RDI,&local_240);
  }
  else {
    local_248 = (uint)Instruction::ACode(in_stack_fffffffffffffbd0,
                                         (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
    local_244 = local_248;
    Function::AddInstruction
              ((Function *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (Instruction)(uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               in_stack_fffffffffffffbd4);
    local_244 = 1;
    local_24c = 1;
    Function::AddInstruction
              ((Function *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (Instruction)(uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               in_stack_fffffffffffffbd4);
  }
  Guard::~Guard((Guard *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
  local_254 = (uint)Instruction::ABCCode
                              (in_stack_fffffffffffffbd0,
                               (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                               (int)in_stack_fffffffffffffbc8,0);
  local_250 = local_254;
  Function::AddInstruction
            ((Function *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (Instruction)(uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20),in_stack_fffffffffffffbd4
            );
  local_2a0 = local_10;
  this_02 = local_298;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::NumericForStatement*,void*)::__8,void>
            (in_stack_fffffffffffffbe0,
             (anon_class_16_2_56ec573d *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::NumericForStatement*,void*)::__9,void>
            (in_stack_fffffffffffffbe0,
             (anon_class_8_1_8991fb9c *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  Guard::Guard(in_stack_fffffffffffffbf0,
               (function<void_()> *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
               in_stack_fffffffffffffbe0);
  std::function<void_()>::~function((function<void_()> *)0x2087ac);
  std::function<void_()>::~function((function<void_()> *)0x2087b9);
  this_01 = local_310;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::NumericForStatement*,void*)::__10,void>
            (in_stack_fffffffffffffbe0,
             (anon_class_8_1_8991fb9c *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::NumericForStatement*,void*)::__11,void>
            (in_stack_fffffffffffffbe0,
             (anon_class_8_1_8991fb9c *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  Guard::Guard((Guard *)this_01,
               (function<void_()> *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
               in_stack_fffffffffffffbe0);
  IVar5.opcode_ = (uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
  std::function<void_()>::~function((function<void_()> *)0x208833);
  std::function<void_()>::~function((function<void_()> *)0x208840);
  IVar3 = Instruction::ABCCode
                    (in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                     (int)in_stack_fffffffffffffbc8,0);
  local_250 = IVar3.opcode_;
  Function::AddInstruction
            ((Function *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),IVar5,
             in_stack_fffffffffffffbd4);
  local_250 = 0;
  sVar8 = Function::AddInstruction
                    ((Function *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),IVar5
                     ,in_stack_fffffffffffffbd4);
  AddLoopJumpInfo(this_01,(SyntaxTree *)CONCAT44(IVar3.opcode_,in_stack_fffffffffffffbe8),
                  (int)(sVar8 >> 0x20),(JumpType)sVar8);
  iVar4 = GenerateRegisterId(this_02);
  InsertName((CodeGenerateVisitor *)this_00,(String *)CONCAT44(iVar2,in_stack_fffffffffffffc58),
             register_id);
  IVar5 = Instruction::ABCode(in_stack_fffffffffffffbd0,
                              (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                              (int)in_stack_fffffffffffffbc8);
  local_250 = IVar5.opcode_;
  Function::AddInstruction
            ((Function *)CONCAT44(iVar4,IVar5.opcode_),(Instruction)(uint)(sVar8 >> 0x20),
             in_stack_fffffffffffffbd4);
  pSVar7 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x2089c6);
  (*pSVar7->_vptr_SyntaxTree[2])(pSVar7,in_RDI,0);
  line_00 = Instruction::ABCCode
                      (in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                       (int)in_stack_fffffffffffffbc8,0);
  local_250 = line_00.opcode_;
  Function::AddInstruction
            ((Function *)CONCAT44(iVar4,IVar5.opcode_),(Instruction)(uint)(sVar8 >> 0x20),
             line_00.opcode_);
  Guard::~Guard((Guard *)CONCAT44(line_00.opcode_,in_stack_fffffffffffffbd0));
  IVar6 = Instruction::AsBxCode
                    (in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                     (int)in_stack_fffffffffffffbc8);
  local_250 = IVar6.opcode_;
  Function::AddInstruction
            ((Function *)CONCAT44(iVar4,IVar5.opcode_),(Instruction)(uint)(sVar8 >> 0x20),
             line_00.opcode_);
  AddLoopJumpInfo(this_01,(SyntaxTree *)CONCAT44(IVar3.opcode_,in_stack_fffffffffffffbe8),
                  (int)(sVar8 >> 0x20),(JumpType)sVar8);
  Guard::~Guard((Guard *)CONCAT44(line_00.opcode_,IVar6.opcode_));
  Guard::~Guard((Guard *)CONCAT44(line_00.opcode_,IVar6.opcode_));
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(NumericForStatement *num_for, void *data)
    {
        CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);

        auto var_register = GenerateRegisterId();
        auto limit_register = GenerateRegisterId();
        auto step_register = GenerateRegisterId();
        auto function = GetCurrentFunction();
        auto line = num_for->name_.line_;

        // Init name, limit, step
        {
            REGISTER_GENERATOR_GUARD();
            ExpVarData name_exp_data{ var_register, var_register + 1 };
            num_for->exp1_->Accept(this, &name_exp_data);
        }
        {
            REGISTER_GENERATOR_GUARD();
            ExpVarData limit_exp_data{ limit_register, limit_register + 1 };
            num_for->exp2_->Accept(this, &limit_exp_data);
        }
        {
            REGISTER_GENERATOR_GUARD();
            if (num_for->exp3_)
            {
                ExpVarData step_exp_data{ step_register, step_register + 1 };
                num_for->exp3_->Accept(this, &step_exp_data);
            }
            else
            {
                // Default step is 1
                auto instruction = Instruction::ACode(OpType_LoadInt, step_register);
                function->AddInstruction(instruction, line);
                // Int value 1
                instruction.opcode_ = 1;
                function->AddInstruction(instruction, line);
            }
        }

        // Init 'for' var, limit, step value
        auto instruction = Instruction::ABCCode(OpType_ForInit, var_register,
                                                limit_register, step_register);
        function->AddInstruction(instruction, line);

        LOOP_GUARD(num_for);
        {
            CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);

            // Check 'for', continue loop or not
            instruction = Instruction::ABCCode(OpType_ForStep, var_register,
                limit_register, step_register);
            function->AddInstruction(instruction, line);

            // Break loop, prepare to jump to the end of the loop
            instruction.opcode_ = 0;
            int index = function->AddInstruction(instruction, line);
            AddLoopJumpInfo(num_for, index, LoopJumpInfo::JumpTail);

            auto name_register = GenerateRegisterId();
            InsertName(num_for->name_.str_, name_register);

            // Prepare name value
            instruction = Instruction::ABCode(OpType_Move, name_register, var_register);
            function->AddInstruction(instruction, line);

            num_for->block_->Accept(this, nullptr);

            // var = var + step
            instruction = Instruction::ABCCode(OpType_Add, var_register,
                var_register, step_register);
            function->AddInstruction(instruction, line);
        }
        // Jump to the begin of the loop
        instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
        int index = function->AddInstruction(instruction, line);
        AddLoopJumpInfo(num_for, index, LoopJumpInfo::JumpHead);
    }